

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

bool __thiscall
MultiSigningProvider::GetCScript(MultiSigningProvider *this,CScriptID *scriptid,CScript *script)

{
  long lVar1;
  pointer puVar2;
  SigningProvider *pSVar3;
  char cVar4;
  int iVar5;
  pointer puVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = (this->m_providers).
           super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_providers).
           super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = puVar6 != puVar2;
  if (bVar7) {
    iVar5 = (*((puVar6->_M_t).
               super___uniq_ptr_impl<SigningProvider,_std::default_delete<SigningProvider>_>._M_t.
               super__Tuple_impl<0UL,_SigningProvider_*,_std::default_delete<SigningProvider>_>.
               super__Head_base<0UL,_SigningProvider_*,_false>._M_head_impl)->_vptr_SigningProvider
              [2])();
    cVar4 = (char)iVar5;
    while (cVar4 == '\0') {
      puVar6 = puVar6 + 1;
      bVar7 = puVar6 != puVar2;
      if (puVar6 == puVar2) break;
      pSVar3 = (puVar6->_M_t).
               super___uniq_ptr_impl<SigningProvider,_std::default_delete<SigningProvider>_>._M_t.
               super__Tuple_impl<0UL,_SigningProvider_*,_std::default_delete<SigningProvider>_>.
               super__Head_base<0UL,_SigningProvider_*,_false>._M_head_impl;
      iVar5 = (*pSVar3->_vptr_SigningProvider[2])(pSVar3,scriptid,script);
      cVar4 = (char)iVar5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool MultiSigningProvider::GetCScript(const CScriptID& scriptid, CScript& script) const
{
    for (const auto& provider: m_providers) {
        if (provider->GetCScript(scriptid, script)) return true;
    }
    return false;
}